

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O2

monitor_list * monitor_list_create(server_extension *extension,list *monitors)

{
  monitor_list *pmVar1;
  
  pmVar1 = (monitor_list *)malloc(0x10);
  if (pmVar1 != (monitor_list *)0x0) {
    pmVar1->extension = extension;
    pmVar1->monitors = monitors;
  }
  return pmVar1;
}

Assistant:

struct monitor_list *monitor_list_create(struct server_extension *extension, struct list *monitors)
{
        struct monitor_list *list = malloc(sizeof(struct monitor_list));

        if (list == NULL) {
                return NULL;
        }

        list->extension = extension;
        list->monitors = monitors;

        return list;
}